

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSwapBuffersWithDamageTests.cpp
# Opt level: O1

FrameSequence *
deqp::egl::anon_unknown_0::generateFrameSequence
          (FrameSequence *__return_storage_ptr__,
          vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
          *frameDrawType,Random *rnd,int numFrames,int width,int height)

{
  undefined1 uVar1;
  pointer __a;
  pointer pFVar2;
  pointer pDVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  deUint32 dVar6;
  int iVar7;
  pointer pDVar8;
  pointer pDVar9;
  ulong uVar10;
  pointer pFVar11;
  pointer pFVar12;
  pointer pDVar13;
  long lVar14;
  Frame *extraout_RDX;
  Frame *extraout_RDX_00;
  Frame *__args;
  Frame *extraout_RDX_01;
  Frame *extraout_RDX_02;
  Frame *extraout_RDX_03;
  Frame *extraout_RDX_04;
  Frame *extraout_RDX_05;
  Frame *extraout_RDX_06;
  uint uVar15;
  long lVar16;
  pointer pDVar17;
  _Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
  *this;
  size_t __n;
  long lVar18;
  long lVar19;
  ulong uVar20;
  pointer pDVar21;
  pointer pFVar22;
  ulong uVar23;
  Frame local_98;
  ulong local_78;
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  *local_70;
  int local_68;
  int local_64;
  DrawType local_60;
  uint local_5c;
  ulong local_58;
  ulong local_50;
  long local_48;
  pointer local_40;
  long local_38;
  
  local_58 = (ulong)(uint)(width / 0x18);
  local_64 = width;
  dVar4 = deRandom_getUint32(&rnd->m_rnd);
  dVar5 = deRandom_getUint32(&rnd->m_rnd);
  dVar6 = deRandom_getUint32(&rnd->m_rnd);
  (__return_storage_ptr__->
  super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar10 = (ulong)(uint)numFrames;
  local_50 = 0;
  local_48 = 0x7ffffffffffffff8;
  __args = extraout_RDX;
  local_78 = uVar10;
  local_70 = frameDrawType;
  local_68 = numFrames;
  do {
    local_98.width = local_68;
    local_98.height = local_64;
    local_98.draws.
    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.draws.
    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.draws.
    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pDVar13 = (frameDrawType->
              super__Vector_base<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
              )._M_impl.super__Vector_impl_data._M_start;
    __n = (ulong)((long)(frameDrawType->
                        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pDVar13) >> 2;
    if ((int)__n < 1) {
      pDVar8 = (pointer)0x0;
    }
    else {
      local_5c = (int)local_50 * (int)local_58;
      lVar14 = 0;
      uVar20 = local_58;
      pDVar21 = (pointer)0x0;
      do {
        pDVar3 = local_98.draws.
                 super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        iVar7 = (int)((long)((ulong)(uint)((int)uVar20 >> 0x1f) << 0x20 | uVar20 & 0xffffffff) /
                     (long)(int)__n);
        __args = (Frame *)(ulong)local_5c;
        lVar18 = lVar14 + 1;
        lVar16 = (ulong)((int)lVar14 * iVar7 + local_5c) << 0x20;
        uVar23 = (ulong)((int)lVar18 * iVar7 + local_5c) << 0x20 | uVar10;
        if (local_98.draws.
            super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_98.draws.
            super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          lVar19 = (long)local_98.draws.
                         super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar21;
          if (lVar19 == local_48) {
            local_98.draws.
            super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
            ._M_impl.super__Vector_impl_data._M_start = pDVar21;
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          local_40 = local_98.draws.
                     super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          uVar20 = (lVar19 >> 3) * -0x5555555555555555;
          uVar10 = uVar20;
          if (local_98.draws.
              super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
              ._M_impl.super__Vector_impl_data._M_finish == pDVar21) {
            uVar10 = 1;
          }
          this = (_Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                  *)(uVar10 + uVar20);
          if ((_Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
               *)0x555555555555554 < this) {
            this = (_Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                    *)0x555555555555555;
          }
          if (CARRY8(uVar10,uVar20)) {
            this = (_Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                    *)0x555555555555555;
          }
          local_60 = pDVar13[lVar14];
          local_38 = lVar18;
          pDVar8 = std::
                   _Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                   ::_M_allocate(this,__n);
          frameDrawType = local_70;
          *(DrawType *)((long)pDVar8 + lVar19) = local_60;
          *(long *)((long)pDVar8 + lVar19 + 4) = lVar16;
          *(ulong *)((long)pDVar8 + lVar19 + 0xc) = uVar23;
          *(uchar *)((long)pDVar8 + lVar19 + 0x14) = (uchar)dVar4;
          *(uchar *)((long)pDVar8 + lVar19 + 0x15) = (uchar)dVar5;
          *(uchar *)((long)pDVar8 + lVar19 + 0x16) = (uchar)dVar6;
          pDVar17 = pDVar8;
          __args = extraout_RDX_00;
          for (pDVar9 = pDVar21; pDVar3 != pDVar9; pDVar9 = pDVar9 + 1) {
            pDVar17->drawType = pDVar9->drawType;
            lVar14 = 1;
            do {
              (pDVar17->rect).bottomLeft.m_data[lVar14 + -1] =
                   (pDVar9->rect).bottomLeft.m_data[lVar14 + -1];
              lVar14 = lVar14 + 1;
            } while (lVar14 == 2);
            lVar14 = 3;
            do {
              uVar15 = (pDVar9->rect).bottomLeft.m_data[lVar14 + -1];
              __args = (Frame *)(ulong)uVar15;
              (pDVar17->rect).bottomLeft.m_data[lVar14 + -1] = uVar15;
              lVar14 = lVar14 + 1;
            } while (lVar14 == 4);
            lVar14 = 0x14;
            do {
              uVar1 = *(undefined1 *)((long)(pDVar9->rect).bottomLeft.m_data + lVar14 + -4);
              __args = (Frame *)CONCAT71((int7)((ulong)__args >> 8),uVar1);
              *(undefined1 *)((long)(pDVar17->rect).bottomLeft.m_data + lVar14 + -4) = uVar1;
              lVar14 = lVar14 + 1;
            } while (lVar14 != 0x17);
            pDVar17 = pDVar17 + 1;
          }
          if (pDVar21 != (pointer)0x0) {
            operator_delete(pDVar21,(long)local_40 - (long)pDVar21);
            __args = extraout_RDX_01;
          }
          local_98.draws.
          super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = pDVar8 + (long)this;
          uVar10 = local_78;
          lVar14 = local_38;
          uVar20 = local_58;
        }
        else {
          (local_98.draws.
           super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
           ._M_impl.super__Vector_impl_data._M_finish)->drawType = pDVar13[lVar14];
          *(long *)((local_98.draws.
                     super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->rect).bottomLeft.m_data = lVar16;
          *(ulong *)((local_98.draws.
                      super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->rect).topRight.m_data = uVar23;
          ((local_98.draws.
            super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
            ._M_impl.super__Vector_impl_data._M_finish)->rect).color.m_data[0] = (uchar)dVar4;
          ((local_98.draws.
            super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
            ._M_impl.super__Vector_impl_data._M_finish)->rect).color.m_data[1] = (uchar)dVar5;
          ((local_98.draws.
            super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
            ._M_impl.super__Vector_impl_data._M_finish)->rect).color.m_data[2] = (uchar)dVar6;
          lVar14 = lVar18;
          pDVar8 = pDVar21;
          pDVar17 = local_98.draws.
                    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        local_98.draws.
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
        ._M_impl.super__Vector_impl_data._M_finish = pDVar17 + 1;
        pDVar13 = (frameDrawType->
                  super__Vector_base<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        __n = (ulong)((long)(frameDrawType->
                            super__Vector_base<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pDVar13) >> 2;
        pDVar21 = pDVar8;
      } while (lVar14 < (int)__n);
    }
    __a = (__return_storage_ptr__->
          super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
          )._M_impl.super__Vector_impl_data._M_finish;
    local_98.draws.
    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
    ._M_impl.super__Vector_impl_data._M_start = pDVar8;
    if (__a == (__return_storage_ptr__->
               super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
               )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      pFVar2 = (__return_storage_ptr__->
               super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((long)__a - (long)pFVar2 == 0x7fffffffffffffe0) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar20 = (long)__a - (long)pFVar2 >> 5;
      uVar10 = uVar20;
      if (__a == pFVar2) {
        uVar10 = 1;
      }
      uVar23 = uVar10 + uVar20;
      if (0x3fffffffffffffe < uVar23) {
        uVar23 = 0x3ffffffffffffff;
      }
      if (CARRY8(uVar10,uVar20)) {
        uVar23 = 0x3ffffffffffffff;
      }
      if (uVar23 == 0) {
        pFVar11 = (pointer)0x0;
      }
      else {
        pFVar11 = (pointer)operator_new(uVar23 << 5);
        __args = extraout_RDX_03;
      }
      std::allocator_traits<std::allocator<deqp::egl::(anonymous_namespace)::Frame>>::
      construct<deqp::egl::(anonymous_namespace)::Frame,deqp::egl::(anonymous_namespace)::Frame_const&>
                ((allocator_type *)(pFVar11 + uVar20),&local_98,__args);
      frameDrawType = local_70;
      pFVar22 = pFVar11;
      for (pFVar12 = pFVar2; __a != pFVar12; pFVar12 = pFVar12 + 1) {
        iVar7 = pFVar12->height;
        pFVar22->width = pFVar12->width;
        pFVar22->height = iVar7;
        (pFVar22->draws).
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pFVar12->draws).
             super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
             ._M_impl.super__Vector_impl_data._M_start;
        *(pointer *)
         ((long)&(pFVar22->draws).
                 super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                 ._M_impl + 8) =
             (pFVar12->draws).
             super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        *(pointer *)
         ((long)&(pFVar22->draws).
                 super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                 ._M_impl + 0x10) =
             (pFVar12->draws).
             super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (pFVar12->draws).
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pFVar12->draws).
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pFVar12->draws).
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pFVar22 = pFVar22 + 1;
      }
      __args = extraout_RDX_04;
      if (pFVar2 != (pointer)0x0) {
        operator_delete(pFVar2,(long)(__return_storage_ptr__->
                                     super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                                     )._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pFVar2);
        __args = extraout_RDX_05;
      }
      (__return_storage_ptr__->
      super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
      )._M_impl.super__Vector_impl_data._M_start = pFVar11;
      (__return_storage_ptr__->
      super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
      )._M_impl.super__Vector_impl_data._M_finish = pFVar22 + 1;
      (__return_storage_ptr__->
      super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = pFVar11 + uVar23;
    }
    else {
      std::allocator_traits<std::allocator<deqp::egl::(anonymous_namespace)::Frame>>::
      construct<deqp::egl::(anonymous_namespace)::Frame,deqp::egl::(anonymous_namespace)::Frame_const&>
                ((allocator_type *)__a,&local_98,__args);
      (__return_storage_ptr__->
      super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
      )._M_impl.super__Vector_impl_data._M_finish = __a + 1;
      __args = extraout_RDX_02;
      frameDrawType = local_70;
    }
    uVar20 = local_50;
    uVar10 = local_78;
    if (local_98.draws.
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.draws.
                      super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_98.draws.
                            super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.draws.
                            super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      __args = extraout_RDX_06;
    }
    uVar15 = (int)uVar20 + 1;
    local_50 = (ulong)uVar15;
  } while (uVar15 != 0x18);
  return __return_storage_ptr__;
}

Assistant:

FrameSequence generateFrameSequence (const vector<DrawType>& frameDrawType, de::Random& rnd, int numFrames, int width, int height)
{
	const int			frameDiff		= height / numFrames;
	const GLubyte		r				= rnd.getUint8();
	const GLubyte		g				= rnd.getUint8();
	const GLubyte		b				= rnd.getUint8();
	const Color			color			(r, g, b);
	FrameSequence		frameSequence;

	for (int frameNdx = 0; frameNdx < numFrames; frameNdx++)
	{
		Frame frame (width, height);

		for (int rectNdx = 0; rectNdx < (int)frameDrawType.size(); rectNdx++)
		{
			const int			rectHeight		= frameDiff / (int)frameDrawType.size();
			const ColoredRect	rect			(IVec2(0, frameNdx*frameDiff+rectNdx*rectHeight), IVec2(width, frameNdx*frameDiff+(rectNdx+1)*rectHeight), color);
			const DrawCommand	drawCommand		(frameDrawType[rectNdx], rect);

			frame.draws.push_back(drawCommand);
		}
		frameSequence.push_back(frame);
	}
	return frameSequence;
}